

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# warnless.c
# Opt level: O0

int curlx_sztosi(ssize_t sznum)

{
  ssize_t sznum_local;
  
  return (uint)sznum & 0x7fffffff;
}

Assistant:

int curlx_sztosi(ssize_t sznum)
{
#ifdef __INTEL_COMPILER
#  pragma warning(push)
#  pragma warning(disable:810) /* conversion may lose significant bits */
#endif

  DEBUGASSERT(sznum >= 0);
  DEBUGASSERT((size_t) sznum <= (size_t) CURL_MASK_SINT);
  return (int)(sznum & (ssize_t) CURL_MASK_SINT);

#ifdef __INTEL_COMPILER
#  pragma warning(pop)
#endif
}